

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-ctest.c
# Opt level: O1

void test37(char *infile,char *password,char *outfile,char *xarg)

{
  int iVar1;
  undefined4 uVar2;
  
  iVar1 = qpdf_read(qpdf,infile,password);
  if (iVar1 != 0) {
    __assert_fail("qpdf_read(qpdf, infile, password) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c",
                  0x466,"void test37(const char *, const char *, const char *, const char *)");
  }
  iVar1 = qpdf_get_num_pages(qpdf);
  if (iVar1 != 0xb) {
    __assert_fail("qpdf_get_num_pages(qpdf) == 11",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c",
                  0x467,"void test37(const char *, const char *, const char *, const char *)");
  }
  uVar2 = qpdf_get_object_by_id(qpdf,3,0);
  uVar2 = qpdf_oh_get_key(qpdf,uVar2,"/Kids");
  iVar1 = qpdf_oh_get_array_n_items(qpdf,uVar2);
  if (iVar1 != 0xb) {
    __assert_fail("qpdf_oh_get_array_n_items(qpdf, kids) == 11",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c",
                  0x46a,"void test37(const char *, const char *, const char *, const char *)");
  }
  qpdf_oh_erase_item(qpdf,uVar2,0);
  iVar1 = qpdf_get_num_pages(qpdf);
  if (iVar1 == 0xb) {
    iVar1 = qpdf_update_all_pages_cache(qpdf);
    if (iVar1 != 0) {
      __assert_fail("qpdf_update_all_pages_cache(qpdf) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c"
                    ,0x46d,"void test37(const char *, const char *, const char *, const char *)");
    }
    iVar1 = qpdf_get_num_pages(qpdf);
    if (iVar1 == 10) {
      return;
    }
    __assert_fail("qpdf_get_num_pages(qpdf) == 10",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c",
                  0x46e,"void test37(const char *, const char *, const char *, const char *)");
  }
  __assert_fail("qpdf_get_num_pages(qpdf) == 11",
                "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c",
                0x46c,"void test37(const char *, const char *, const char *, const char *)");
}

Assistant:

static void
test37(char const* infile, char const* password, char const* outfile, char const* xarg)
{
    /* This test uses 11-pages.pdf */

    /* Manually manipulate pages tree */
    assert(qpdf_read(qpdf, infile, password) == 0);
    assert(qpdf_get_num_pages(qpdf) == 11);
    qpdf_oh pages = qpdf_get_object_by_id(qpdf, 3, 0);
    qpdf_oh kids = qpdf_oh_get_key(qpdf, pages, "/Kids");
    assert(qpdf_oh_get_array_n_items(qpdf, kids) == 11);
    qpdf_oh_erase_item(qpdf, kids, 0);
    assert(qpdf_get_num_pages(qpdf) == 11);
    assert(qpdf_update_all_pages_cache(qpdf) == 0);
    assert(qpdf_get_num_pages(qpdf) == 10);
}